

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpString.c
# Opt level: O3

UpnpString * UpnpString_dup(UpnpString *p)

{
  UpnpString *__ptr;
  char *pcVar1;
  
  __ptr = (UpnpString *)calloc(1,0x10);
  if (__ptr != (UpnpString *)0x0) {
    *(undefined8 *)__ptr = *(undefined8 *)p;
    pcVar1 = strdup(*(char **)(p + 8));
    *(char **)(__ptr + 8) = pcVar1;
    if (pcVar1 != (char *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (UpnpString *)0x0;
}

Assistant:

UpnpString *UpnpString_dup(const UpnpString *p)
{
	struct SUpnpString *q = calloc((size_t)1, sizeof(struct SUpnpString));
	if (q == NULL) {
		goto error_handler1;
	}
	q->m_length = ((struct SUpnpString *)p)->m_length;
	q->m_string = strdup(((struct SUpnpString *)p)->m_string);
	if (q->m_string == NULL) {
		goto error_handler2;
	}

	return (UpnpString *)q;

	/*free(q->m_string); */
error_handler2:
	free(q);
error_handler1:
	return NULL;
}